

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall myvk::Buffer::~Buffer(Buffer *this)

{
  VkBuffer buffer;
  
  (this->super_BufferBase).super_DeviceObjectBase.super_Base._vptr_Base =
       (_func_int **)&PTR__Buffer_003221f0;
  buffer = (this->super_BufferBase).m_buffer;
  if (buffer != (VkBuffer)0x0) {
    vmaDestroyBuffer(((this->m_device_ptr).
                      super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_allocator,buffer,this->m_allocation);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_BufferBase).super_DeviceObjectBase.super_Base.
              super_enable_shared_from_this<myvk::Base>._M_weak_this.
              super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Buffer::~Buffer() {
	if (m_buffer)
		vmaDestroyBuffer(m_device_ptr->GetAllocatorHandle(), m_buffer, m_allocation);
}